

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int __thiscall RPCHelpMan::Arg<int>(RPCHelpMan *this,string_view key)

{
  long lVar1;
  int iVar2;
  size_t i;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  i = GetParamIndex(this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar2 = ArgValue<int>(this,i);
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

auto Arg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return argument (required or with default value).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value.
            return ArgValue<R>(i);
        } else {
            // Return everything else by reference.
            return ArgValue<const R&>(i);
        }
    }